

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::ImulExtendedCase::compare
          (ImulExtendedCase *this,void **inputs,void **outputs)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  ostringstream *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  Hex<8UL> local_30;
  
  uVar2 = glu::getDataTypeScalarSize
                    ((((this->super_IntegerFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  bVar8 = true;
  if (0 < (int)uVar2) {
    uVar5 = (long)*inputs[1] * (long)**inputs;
    uVar6 = uVar5 >> 0x20;
    if (**outputs == (int)(uVar5 >> 0x20)) {
      bVar8 = false;
      uVar4 = 0;
      do {
        uVar7 = uVar4;
        if (*(int *)((long)outputs[1] + uVar4 * 4) != (int)uVar5) break;
        if ((ulong)uVar2 - 1 == uVar4) {
          return true;
        }
        uVar7 = uVar4 + 1;
        bVar8 = uVar2 <= uVar7;
        uVar5 = (long)*(int *)((long)inputs[1] + (uVar4 + 1) * 4) *
                (long)*(int *)((long)*inputs + (uVar4 + 1) * 4);
        uVar6 = uVar5 >> 0x20;
        lVar1 = uVar4 + 1;
        uVar4 = uVar7;
      } while (*(int *)((long)*outputs + lVar1 * 4) == (int)(uVar5 >> 0x20));
    }
    else {
      bVar8 = false;
      uVar7 = 0;
    }
    this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>
              (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
    poVar3 = (ostream *)std::ostream::operator<<(this_00,(int)uVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] = ",4);
    local_30.value = uVar6;
    poVar3 = tcu::Format::Hex<8UL>::toStream(&local_30,poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    local_30.value = uVar5 & 0xffffffff;
    tcu::Format::Hex<8UL>::toStream(&local_30,poVar3);
  }
  return bVar8;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deInt32	in0		= ((const deInt32*)inputs[0])[compNdx];
			const deInt32	in1		= ((const deInt32*)inputs[1])[compNdx];
			const deInt32	out0	= ((const deInt32*)outputs[0])[compNdx];
			const deInt32	out1	= ((const deInt32*)outputs[1])[compNdx];
			const deInt64	mul64	= deInt64(in0)*deInt64(in1);
			const deInt32	ref0	= deInt32(mul64 >> 32);
			const deInt32	ref1	= deInt32(mul64 & 0xffffffffu);

			if (out0 != ref0 || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}